

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NeuralNetwork.pb.h
# Opt level: O1

ConvolutionLayerParams * __thiscall
CoreML::Specification::NeuralNetworkLayer::mutable_convolution(NeuralNetworkLayer *this)

{
  ConvolutionLayerParams *this_00;
  
  if (this->_oneof_case_[0] != 100) {
    clear_layer(this);
    this->_oneof_case_[0] = 100;
    this_00 = (ConvolutionLayerParams *)operator_new(0xb0);
    ConvolutionLayerParams::ConvolutionLayerParams(this_00);
    (this->layer_).convolution_ = this_00;
  }
  return (this->layer_).convolution_;
}

Assistant:

inline ::CoreML::Specification::ConvolutionLayerParams* NeuralNetworkLayer::mutable_convolution() {
  if (!has_convolution()) {
    clear_layer();
    set_has_convolution();
    layer_.convolution_ = new ::CoreML::Specification::ConvolutionLayerParams;
  }
  // @@protoc_insertion_point(field_mutable:CoreML.Specification.NeuralNetworkLayer.convolution)
  return layer_.convolution_;
}